

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_tec(REF_CAVITY ref_cavity,char *filename)

{
  REF_INT RVar1;
  int iVar2;
  REF_GRID pRVar3;
  REF_CELL pRVar4;
  REF_DBL *pRVar5;
  REF_CAVITY pRVar6;
  uint uVar7;
  FILE *pFVar8;
  REF_LIST pRVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  REF_DICT node_dict;
  REF_INT local;
  REF_DICT face_dict;
  REF_INT nodes [27];
  REF_DICT local_e8;
  int local_dc;
  REF_DICT local_d8;
  FILE *local_d0;
  REF_CAVITY local_c8;
  REF_GRID local_c0;
  REF_INT local_b4;
  long local_b0;
  REF_INT local_a8 [30];
  
  pRVar3 = ref_cavity->ref_grid;
  RVar1 = ref_cavity->node;
  pFVar8 = fopen(filename,"w");
  if (pFVar8 == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x837,
           "ref_cavity_tec","unable to open file");
    uVar7 = 2;
  }
  else {
    fwrite("title=\"tecplot refine cavity\"\n",0x1e,1,pFVar8);
    fwrite("variables = \"x\" \"y\" \"z\" \"i\"\n",0x1c,1,pFVar8);
    uVar7 = ref_dict_create(&local_e8);
    if (uVar7 == 0) {
      uVar7 = ref_dict_create(&local_d8);
      if (uVar7 == 0) {
        pRVar4 = pRVar3->cell[8];
        pRVar9 = ref_cavity->tet_list;
        local_d0 = pFVar8;
        local_c8 = ref_cavity;
        local_c0 = pRVar3;
        local_b4 = RVar1;
        if (0 < pRVar9->n) {
          lVar10 = 0;
          do {
            RVar1 = pRVar9->value[lVar10];
            uVar7 = ref_dict_store(local_d8,RVar1,0);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x842,"ref_cavity_tec",(ulong)uVar7,"store");
              return uVar7;
            }
            uVar7 = ref_cell_nodes(pRVar4,RVar1,local_a8);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x843,"ref_cavity_tec",(ulong)uVar7,"nodes");
              return uVar7;
            }
            if (0 < pRVar4->node_per) {
              lVar12 = 0;
              do {
                uVar7 = ref_dict_store(local_e8,local_a8[lVar12],0);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x845,"ref_cavity_tec",(ulong)uVar7,"store");
                  return uVar7;
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 < pRVar4->node_per);
            }
            lVar10 = lVar10 + 1;
            pRVar9 = local_c8->tet_list;
          } while (lVar10 < pRVar9->n);
        }
        pFVar8 = local_d0;
        if ((0 < local_e8->n) && (0 < local_d8->n)) {
          fprintf(local_d0,
                  "zone t=\"old-tet\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)(uint)local_e8->n,(ulong)(uint)local_d8->n,"point","fetetrahedron");
          pRVar3 = local_c0;
          if (0 < local_e8->n) {
            lVar10 = 0;
            do {
              local_dc = local_e8->key[lVar10];
              lVar12 = (long)local_dc;
              pRVar5 = pRVar3->node->real;
              fprintf(pFVar8," %.16e %.16e %.16e %d\n",pRVar5[lVar12 * 0xf],pRVar5[lVar12 * 0xf + 1]
                      ,pRVar5[lVar12 * 0xf + 2]);
              lVar10 = lVar10 + 1;
            } while (lVar10 < local_e8->n);
          }
          if (0 < local_d8->n) {
            lVar10 = 0;
            do {
              uVar7 = ref_cell_nodes(pRVar4,local_d8->key[lVar10],local_a8);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x859,"ref_cavity_tec",(ulong)uVar7,"nodes");
                return uVar7;
              }
              if (0 < pRVar4->node_per) {
                lVar12 = 0;
                do {
                  uVar7 = ref_dict_location(local_e8,local_a8[lVar12],&local_dc);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x85b,"ref_cavity_tec",(ulong)uVar7,"ret");
                    return uVar7;
                  }
                  fprintf(local_d0," %d",(ulong)(local_dc + 1));
                  lVar12 = lVar12 + 1;
                } while (lVar12 < pRVar4->node_per);
              }
              fputc(10,local_d0);
              lVar10 = lVar10 + 1;
            } while (lVar10 < local_d8->n);
          }
        }
        uVar7 = ref_dict_free(local_d8);
        RVar1 = local_b4;
        pRVar6 = local_c8;
        if (uVar7 == 0) {
          uVar7 = ref_dict_free(local_e8);
          if (uVar7 == 0) {
            uVar7 = ref_dict_create(&local_e8);
            if (uVar7 == 0) {
              uVar7 = ref_dict_create(&local_d8);
              if (uVar7 == 0) {
                uVar7 = ref_dict_store(local_e8,RVar1,0);
                if (uVar7 == 0) {
                  if (0 < pRVar6->maxface) {
                    lVar10 = 0;
                    lVar12 = 0;
                    do {
                      if (local_c8->f2n[lVar12 * 3] != -1) {
                        uVar7 = ref_dict_store(local_d8,(REF_INT)lVar12,0);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0x869,"ref_cavity_tec",(ulong)uVar7,"store");
                          return uVar7;
                        }
                        lVar11 = 0;
                        do {
                          uVar7 = ref_dict_store(local_e8,*(REF_INT *)
                                                           ((long)local_c8->f2n +
                                                           lVar11 * 4 + lVar10),0);
                          if (uVar7 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0x86d,"ref_cavity_tec",(ulong)uVar7,"store");
                            return uVar7;
                          }
                          lVar11 = lVar11 + 1;
                        } while (lVar11 != 3);
                      }
                      lVar12 = lVar12 + 1;
                      lVar10 = lVar10 + 0xc;
                    } while (lVar12 < local_c8->maxface);
                  }
                  pFVar8 = local_d0;
                  if ((0 < local_e8->n) && (0 < local_d8->n)) {
                    fprintf(local_d0,
                            "zone t=\"new-tet\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                            ,(ulong)(uint)local_e8->n,(ulong)(uint)local_d8->n,"point",
                            "fetetrahedron");
                    pRVar3 = local_c0;
                    if (0 < local_e8->n) {
                      lVar10 = 0;
                      do {
                        local_dc = local_e8->key[lVar10];
                        lVar12 = (long)local_dc;
                        pRVar5 = pRVar3->node->real;
                        fprintf(pFVar8," %.16e %.16e %.16e %d\n",pRVar5[lVar12 * 0xf],
                                pRVar5[lVar12 * 0xf + 1],pRVar5[lVar12 * 0xf + 2]);
                        lVar10 = lVar10 + 1;
                      } while (lVar10 < local_e8->n);
                    }
                    if (0 < local_d8->n) {
                      local_b0 = 0;
                      do {
                        iVar2 = local_d8->key[local_b0];
                        uVar7 = ref_dict_location(local_e8,local_b4,&local_dc);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0x881,"ref_cavity_tec",(ulong)uVar7,"center node");
                          return uVar7;
                        }
                        fprintf(local_d0," %d",(ulong)(local_dc + 1));
                        lVar10 = 0;
                        do {
                          uVar7 = ref_dict_location(local_e8,local_c8->f2n[(long)iVar2 * 3 + lVar10]
                                                    ,&local_dc);
                          if (uVar7 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0x886,"ref_cavity_tec",(ulong)uVar7,"ret");
                            return uVar7;
                          }
                          fprintf(local_d0," %d",(ulong)(local_dc + 1));
                          lVar10 = lVar10 + 1;
                        } while (lVar10 != 3);
                        fputc(10,local_d0);
                        local_b0 = local_b0 + 1;
                      } while (local_b0 < local_d8->n);
                    }
                  }
                  uVar7 = ref_dict_free(local_d8);
                  if (uVar7 == 0) {
                    uVar7 = ref_dict_free(local_e8);
                    if (uVar7 == 0) {
                      uVar7 = ref_dict_create(&local_e8);
                      if (uVar7 == 0) {
                        uVar7 = ref_dict_create(&local_d8);
                        if (uVar7 == 0) {
                          pRVar4 = local_c0->cell[3];
                          pRVar9 = local_c8->tri_list;
                          if (0 < pRVar9->n) {
                            lVar10 = 0;
                            do {
                              RVar1 = pRVar9->value[lVar10];
                              uVar7 = ref_dict_store(local_d8,RVar1,0);
                              if (uVar7 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                       ,0x898,"ref_cavity_tec",(ulong)uVar7,"store");
                                return uVar7;
                              }
                              uVar7 = ref_cell_nodes(pRVar4,RVar1,local_a8);
                              if (uVar7 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                       ,0x899,"ref_cavity_tec",(ulong)uVar7,"nodes");
                                return uVar7;
                              }
                              if (0 < pRVar4->node_per) {
                                lVar12 = 0;
                                do {
                                  uVar7 = ref_dict_store(local_e8,local_a8[lVar12],0);
                                  if (uVar7 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                           ,0x89b,"ref_cavity_tec",(ulong)uVar7,"store");
                                    return uVar7;
                                  }
                                  lVar12 = lVar12 + 1;
                                } while (lVar12 < pRVar4->node_per);
                              }
                              lVar10 = lVar10 + 1;
                              pRVar9 = local_c8->tri_list;
                            } while (lVar10 < pRVar9->n);
                          }
                          if ((0 < local_e8->n) && (0 < local_d8->n)) {
                            fprintf(local_d0,
                                    "zone t=\"old-tri\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                                    ,(ulong)(uint)local_e8->n,(ulong)(uint)local_d8->n,"point",
                                    "fetriangle");
                            if (0 < local_e8->n) {
                              lVar10 = 0;
                              do {
                                local_dc = local_e8->key[lVar10];
                                lVar12 = (long)local_dc;
                                pRVar5 = local_c0->node->real;
                                fprintf(local_d0," %.16e %.16e %.16e %d\n",pRVar5[lVar12 * 0xf],
                                        pRVar5[lVar12 * 0xf + 1],pRVar5[lVar12 * 0xf + 2]);
                                lVar10 = lVar10 + 1;
                              } while (lVar10 < local_e8->n);
                            }
                            if (0 < local_d8->n) {
                              lVar10 = 0;
                              do {
                                uVar7 = ref_cell_nodes(pRVar4,local_d8->key[lVar10],local_a8);
                                if (uVar7 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                         ,0x8af,"ref_cavity_tec",(ulong)uVar7,"nodes");
                                  return uVar7;
                                }
                                if (0 < pRVar4->node_per) {
                                  lVar12 = 0;
                                  do {
                                    uVar7 = ref_dict_location(local_e8,local_a8[lVar12],&local_dc);
                                    if (uVar7 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                             ,0x8b1,"ref_cavity_tec",(ulong)uVar7,"ret");
                                      return uVar7;
                                    }
                                    fprintf(local_d0," %d",(ulong)(local_dc + 1));
                                    lVar12 = lVar12 + 1;
                                  } while (lVar12 < pRVar4->node_per);
                                }
                                fputc(10,local_d0);
                                lVar10 = lVar10 + 1;
                              } while (lVar10 < local_d8->n);
                            }
                          }
                          uVar7 = ref_dict_free(local_d8);
                          if (uVar7 == 0) {
                            uVar7 = ref_dict_free(local_e8);
                            if (uVar7 == 0) {
                              uVar7 = ref_dict_create(&local_e8);
                              if (uVar7 == 0) {
                                uVar7 = ref_dict_create(&local_d8);
                                if (uVar7 == 0) {
                                  uVar7 = ref_dict_store(local_e8,local_b4,0);
                                  if (uVar7 == 0) {
                                    if (0 < local_c8->maxseg) {
                                      lVar10 = 0;
                                      lVar12 = 0;
                                      do {
                                        if (local_c8->s2n[lVar12 * 3] != -1) {
                                          uVar7 = ref_dict_store(local_d8,(REF_INT)lVar12,0);
                                          if (uVar7 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                                  ,0x8bf,"ref_cavity_tec",(ulong)uVar7,"store");
                                            return uVar7;
                                          }
                                          lVar11 = 0;
                                          do {
                                            uVar7 = ref_dict_store(local_e8,*(REF_INT *)
                                                                             ((long)local_c8->s2n +
                                                                             lVar11 * 4 + lVar10),0)
                                            ;
                                            if (uVar7 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                                  ,0x8c3,"ref_cavity_tec",(ulong)uVar7,"store");
                                              return uVar7;
                                            }
                                            lVar11 = lVar11 + 1;
                                          } while (lVar11 == 1);
                                        }
                                        lVar12 = lVar12 + 1;
                                        lVar10 = lVar10 + 0xc;
                                      } while (lVar12 < local_c8->maxseg);
                                    }
                                    if ((0 < local_e8->n) && (0 < local_d8->n)) {
                                      fprintf(local_d0,
                                              "zone t=\"new-tri\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                                              ,(ulong)(uint)local_e8->n,(ulong)(uint)local_d8->n,
                                              "point","fetriangle");
                                      if (0 < local_e8->n) {
                                        lVar10 = 0;
                                        do {
                                          local_dc = local_e8->key[lVar10];
                                          lVar12 = (long)local_dc;
                                          pRVar5 = local_c0->node->real;
                                          fprintf(local_d0," %.16e %.16e %.16e %d\n",
                                                  pRVar5[lVar12 * 0xf],pRVar5[lVar12 * 0xf + 1],
                                                  pRVar5[lVar12 * 0xf + 2]);
                                          lVar10 = lVar10 + 1;
                                        } while (lVar10 < local_e8->n);
                                      }
                                      if (0 < local_d8->n) {
                                        local_c0 = (REF_GRID)0x0;
                                        do {
                                          iVar2 = local_d8->key[(long)local_c0];
                                          uVar7 = ref_dict_location(local_e8,local_b4,&local_dc);
                                          if (uVar7 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                                  ,0x8d7,"ref_cavity_tec",(ulong)uVar7,"center node"
                                                  );
                                            return uVar7;
                                          }
                                          fprintf(local_d0," %d",(ulong)(local_dc + 1));
                                          lVar10 = 0;
                                          do {
                                            uVar7 = ref_dict_location(local_e8,local_c8->s2n
                                                                               [(long)iVar2 * 3 +
                                                                                lVar10],&local_dc);
                                            if (uVar7 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                                  ,0x8dc,"ref_cavity_tec",(ulong)uVar7,"ret");
                                              return uVar7;
                                            }
                                            fprintf(local_d0," %d",(ulong)(local_dc + 1));
                                            lVar10 = lVar10 + 1;
                                          } while (lVar10 == 1);
                                          fputc(10,local_d0);
                                          local_c0 = (REF_GRID)((long)&local_c0->mpi + 1);
                                        } while ((long)local_c0 < (long)local_d8->n);
                                      }
                                    }
                                    uVar7 = ref_dict_free(local_d8);
                                    if (uVar7 == 0) {
                                      uVar7 = ref_dict_free(local_e8);
                                      if (uVar7 == 0) {
                                        fclose(local_d0);
                                        uVar7 = 0;
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                               ,0x8e4,"ref_cavity_tec",(ulong)uVar7,"free nodes");
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                             ,0x8e3,"ref_cavity_tec",(ulong)uVar7,"free face");
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                           ,0x8bd,"ref_cavity_tec",(ulong)uVar7,"store");
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                         ,0x8bb,"ref_cavity_tec",(ulong)uVar7,"create faces");
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                       ,0x8ba,"ref_cavity_tec",(ulong)uVar7,"create nodes");
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0x8b8,"ref_cavity_tec",(ulong)uVar7,"free nodes");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0x8b7,"ref_cavity_tec",(ulong)uVar7,"free tris");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0x893,"ref_cavity_tec",(ulong)uVar7,"create faces");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x892,"ref_cavity_tec",(ulong)uVar7,"create nodes");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x88e,"ref_cavity_tec",(ulong)uVar7,"free nodes");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x88d,"ref_cavity_tec",(ulong)uVar7,"free face");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x867,"ref_cavity_tec",(ulong)uVar7,"store");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x865,"ref_cavity_tec",(ulong)uVar7,"create faces");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x864,"ref_cavity_tec",(ulong)uVar7,"create nodes");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x862,"ref_cavity_tec",(ulong)uVar7,"free nodes");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x861,"ref_cavity_tec",(ulong)uVar7,"free tris");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x83d,"ref_cavity_tec",(ulong)uVar7,"create faces");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x83c,"ref_cavity_tec",(ulong)uVar7,"create nodes");
    }
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_tec(REF_CAVITY ref_cavity, const char *filename) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_DICT node_dict, face_dict;
  REF_CELL ref_cell;
  REF_INT face, face_node, seg, seg_node;
  REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local;
  REF_DBL xyz_phys[3];
  const char *zonetype;
  FILE *f;

  zonetype = "fetetrahedron";

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine cavity\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"i\"\n");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_dict_store(face_dict, cell, 0), "store");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"old-tet\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      cell = ref_dict_key(face_dict, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }
  RSS(ref_dict_free(face_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  RSS(ref_dict_store(node_dict, node, 0), "store");
  each_ref_cavity_valid_face(ref_cavity, face) {
    RSS(ref_dict_store(face_dict, face, 0), "store");
    each_ref_cavity_face_node(ref_cavity, face_node) {
      RSS(ref_dict_store(node_dict, ref_cavity_f2n(ref_cavity, face_node, face),
                         0),
          "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"new-tet\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      face = ref_dict_key(face_dict, item);
      RSS(ref_dict_location(node_dict, node, &local), "center node");
      fprintf(f, " %d", local + 1);
      each_ref_cavity_face_node(ref_cavity, face_node) {
        RSS(ref_dict_location(
                node_dict, ref_cavity_f2n(ref_cavity, face_node, face), &local),
            "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }

  RSS(ref_dict_free(face_dict), "free face");
  RSS(ref_dict_free(node_dict), "free nodes");

  zonetype = "fetriangle";

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_dict_store(face_dict, cell, 0), "store");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"old-tri\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      cell = ref_dict_key(face_dict, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }
  RSS(ref_dict_free(face_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  RSS(ref_dict_store(node_dict, node, 0), "store");
  each_ref_cavity_valid_seg(ref_cavity, face) {
    RSS(ref_dict_store(face_dict, face, 0), "store");
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      RSS(ref_dict_store(node_dict, ref_cavity_s2n(ref_cavity, seg_node, face),
                         0),
          "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"new-tri\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      seg = ref_dict_key(face_dict, item);
      RSS(ref_dict_location(node_dict, node, &local), "center node");
      fprintf(f, " %d", local + 1);
      each_ref_cavity_seg_node(ref_cavity, seg_node) {
        RSS(ref_dict_location(
                node_dict, ref_cavity_s2n(ref_cavity, seg_node, seg), &local),
            "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }

  RSS(ref_dict_free(face_dict), "free face");
  RSS(ref_dict_free(node_dict), "free nodes");
  fclose(f);

  return REF_SUCCESS;
}